

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O0

string * __thiscall
chrono::ChClassFactory::_GetClassTagName_abi_cxx11_(ChClassFactory *this,type_info *mtype)

{
  bool bVar1;
  pointer ppVar2;
  string *psVar3;
  ChException *this_00;
  allocator local_59;
  string local_58;
  _Node_iterator_base<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>,_false>
  local_38;
  type_index local_30;
  _Node_iterator_base<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>,_false>
  *local_20;
  iterator *it;
  type_info *mtype_local;
  ChClassFactory *this_local;
  
  it = (iterator *)mtype;
  mtype_local = (type_info *)this;
  std::type_index::type_index(&local_30,mtype);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_chrono::ChClassRegistrationBase_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>_>_>
       ::find((unordered_map<std::type_index,_chrono::ChClassRegistrationBase_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>_>_>
               *)(this + 0x38),&local_30);
  local_20 = &local_28;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_chrono::ChClassRegistrationBase_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>_>_>
       ::end((unordered_map<std::type_index,_chrono::ChClassRegistrationBase_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>_>_>
              *)(this + 0x38));
  bVar1 = std::__detail::operator!=(&local_28,&local_38);
  if (!bVar1) {
    this_00 = (ChException *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_58,
               "ChClassFactory::GetClassTagName() cannot find the class. Please register it.\n",
               &local_59);
    ChException::ChException(this_00,&local_58);
    __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_std::type_index,_chrono::ChClassRegistrationBase_*>,_false,_false>
                         *)local_20);
  psVar3 = (string *)(**(code **)(*(long *)ppVar2->second + 0x18))();
  return psVar3;
}

Assistant:

std::string& _GetClassTagName(const std::type_info& mtype) {
        const auto &it = class_map_typeids.find(std::type_index(mtype));
        if (it != class_map_typeids.end()) {
            return it->second->get_tag_name();
        }
        throw ( ChException("ChClassFactory::GetClassTagName() cannot find the class. Please register it.\n") );
    }